

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

field<discordpp::EmbedProvider> * __thiscall
discordpp::field<discordpp::EmbedProvider>::operator=
          (field<discordpp::EmbedProvider> *this,field<discordpp::EmbedProvider> *f)

{
  _Head_base<0UL,_discordpp::EmbedProvider_*,_false> _Var1;
  _Head_base<0UL,_discordpp::EmbedProvider_*,_false> _Var2;
  pointer *__ptr;
  
  _Var1._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedProvider_*,_std::default_delete<discordpp::EmbedProvider>_>
       .super__Head_base<0UL,_discordpp::EmbedProvider_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (EmbedProvider *)0x0) {
    _Var2._M_head_impl = (EmbedProvider *)0x0;
  }
  else {
    _Var2._M_head_impl = (EmbedProvider *)operator_new(0x30);
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
              (&((_Var2._M_head_impl)->name).
                super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,(field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&(_Var1._M_head_impl)->name + 8));
    ((_Var2._M_head_impl)->name)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
              (&((_Var2._M_head_impl)->url).
                super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,(field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&(_Var1._M_head_impl)->url + 8));
    ((_Var2._M_head_impl)->url)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  }
  _Var1._M_head_impl =
       (this->t_)._M_t.
       super___uniq_ptr_impl<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedProvider_*,_std::default_delete<discordpp::EmbedProvider>_>
       .super__Head_base<0UL,_discordpp::EmbedProvider_*,_false>._M_head_impl;
  (this->t_)._M_t.
  super___uniq_ptr_impl<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>.
  _M_t.
  super__Tuple_impl<0UL,_discordpp::EmbedProvider_*,_std::default_delete<discordpp::EmbedProvider>_>
  .super__Head_base<0UL,_discordpp::EmbedProvider_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (EmbedProvider *)0x0) {
    std::default_delete<discordpp::EmbedProvider>::operator()
              ((default_delete<discordpp::EmbedProvider> *)this,_Var1._M_head_impl);
  }
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }